

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

GLint __thiscall
gl4cts::GLSL420Pack::Utils::program::getUniformLocation(program *this,GLchar *uniform_name)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  TestError *this_02;
  GLchar *local_1a0;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_1a0 = uniform_name;
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0xb48))(this->m_program_object_id,local_1a0);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x46fd);
  if (iVar2 != -1) {
    return iVar2;
  }
  local_198._0_8_ = this->m_context->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Uniform: ",9);
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_198,&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
             " is not available",0x11);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Uniform is not available",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x4704);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GLint Utils::program::getUniformLocation(const glw::GLchar* uniform_name) const
{
	const glw::Functions& gl	   = m_context.getRenderContext().getFunctions();
	GLint				  location = -1;

	location = gl.getUniformLocation(m_program_object_id, uniform_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

	if (-1 == location)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Uniform: " << uniform_name
											<< " is not available" << tcu::TestLog::EndMessage;

		TCU_FAIL("Uniform is not available");
	}

	return location;
}